

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **objToLoad,int initSize,
               bool toCallDestructor,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this;
  XSerializeEngine *__nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  XMLSize_t maxElems;
  XMLSize_t i;
  ulong uVar3;
  SchemaElementDecl *data;
  XMLSize_t vectorSize;
  
  __nbytes = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)XMemory::operator_new(0x28,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      maxElems = 0x10;
      if (-1 < initSize) {
        maxElems = (XMLSize_t)(uint)initSize;
      }
      __nbytes = (XSerializeEngine *)(ulong)toCallDestructor;
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                (this,maxElems,pMVar2,toCallDestructor);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    vectorSize = 0;
    XSerializeEngine::readSize(serEng,&vectorSize);
    __buf = extraout_RDX;
    for (uVar3 = 0; uVar3 < vectorSize; uVar3 = uVar3 + 1) {
      data = (SchemaElementDecl *)XSerializeEngine::read(serEng,0x4344a0,__buf,(size_t)__nbytes);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(*objToLoad,&data);
      __buf = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<SchemaElementDecl*>**       objToLoad
                                   , int                                       initSize
                                   , bool                                      toCallDestructor
                                   , XSerializeEngine&                         serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<SchemaElementDecl*>(
                                                               initSize
                                                             , serEng.getMemoryManager()
                                                             , toCallDestructor
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            SchemaElementDecl* data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }
}